

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void UYVYToUV422Row_C(uint8_t *src_uyvy,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  int x;
  int width_local;
  uint8_t *dst_v_local;
  uint8_t *dst_u_local;
  uint8_t *src_uyvy_local;
  
  dst_v_local = dst_v;
  dst_u_local = dst_u;
  src_uyvy_local = src_uyvy;
  for (x = 0; x < width; x = x + 2) {
    *dst_u_local = *src_uyvy_local;
    *dst_v_local = src_uyvy_local[2];
    src_uyvy_local = src_uyvy_local + 4;
    dst_u_local = dst_u_local + 1;
    dst_v_local = dst_v_local + 1;
  }
  return;
}

Assistant:

void UYVYToUV422Row_C(const uint8_t* src_uyvy,
                      uint8_t* dst_u,
                      uint8_t* dst_v,
                      int width) {
  // Output a row of UV values.
  int x;
  for (x = 0; x < width; x += 2) {
    dst_u[0] = src_uyvy[0];
    dst_v[0] = src_uyvy[2];
    src_uyvy += 4;
    dst_u += 1;
    dst_v += 1;
  }
}